

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::Extents(ON_Viewport *this,double angle,ON_3dPoint *center,double radius)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  double local_48;
  double far_dist;
  double near_dist;
  double target_dist;
  double radius_local;
  ON_3dPoint *center_local;
  double angle_local;
  ON_Viewport *this_local;
  
  target_dist = radius;
  radius_local = (double)center;
  center_local = (ON_3dPoint *)angle;
  angle_local = (double)this;
  uVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
  dVar1 = target_dist;
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if (((target_dist <= 0.0) || ((double)center_local <= 0.0)) ||
          (1.5707963033882073 <= (double)center_local)) {
    this_local._7_1_ = false;
  }
  else {
    dVar5 = sin((double)center_local);
    near_dist = dVar1 / dVar5;
    bVar2 = IsPerspectiveProjection(this);
    dVar1 = radius_local;
    if (!bVar2) {
      near_dist = target_dist * 1.0625 + near_dist;
    }
    dVar5 = near_dist;
    far_dist = target_dist * -1.0625 + near_dist;
    if (far_dist < target_dist * 0.0625) {
      far_dist = target_dist * 0.0625;
    }
    if (far_dist < this->m__MIN_NEAR_DIST) {
      far_dist = this->m__MIN_NEAR_DIST;
    }
    local_48 = target_dist * 1.0625 + near_dist;
    CameraZ(&local_90,this);
    ::operator*(&local_78,dVar5,&local_90);
    ON_3dPoint::operator+(&local_60,(ON_3dPoint *)dVar1,&local_78);
    SetCameraLocation(this,&local_60);
    bVar2 = SetFrustumNearFar(this,far_dist,local_48);
    if (bVar2) {
      bVar2 = SetCameraAngle(this,(double)center_local);
      if (bVar2) {
        iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
        this_local._7_1_ = (bool)(-(char)iVar4 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::Extents( double angle, const ON_3dPoint& center, double radius )
{
  if ( !IsValid() )
    return false;

  double target_dist, near_dist, far_dist;

  if ( radius <= 0.0 || 
       angle  <= 0.0 || 
       angle  >= 0.5*ON_PI*(1.0-ON_SQRT_EPSILON) )
    return false;
  
  target_dist = radius/sin(angle);
  if ( !IsPerspectiveProjection() )
  {
    target_dist += 1.0625*radius;
  }
  near_dist = target_dist - 1.0625*radius;
  if ( near_dist < 0.0625*radius )
    near_dist = 0.0625*radius;
  if ( near_dist < m__MIN_NEAR_DIST )
    near_dist = m__MIN_NEAR_DIST;
  far_dist = target_dist +  1.0625*radius;

  SetCameraLocation( center + target_dist*CameraZ() );
  if ( !SetFrustumNearFar( near_dist, far_dist ) )
    return false;
  if ( !SetCameraAngle( angle ) )
    return false;

  return IsValid()?true:false;
}